

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

bool verona::resolve_typename(Lookup *p,Node *n)

{
  bool bVar1;
  bool bVar2;
  Node def;
  Nodes defs;
  WFLookup id;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_f0;
  Nodes local_e0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_b8;
  WFLookup local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 *local_60;
  
  local_a8.wf = (Wellformed *)local_78;
  local_78._0_8_ = TypeClassName;
  local_78._8_8_ = &TypeAliasName;
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TypeParamName;
  local_60 = TypeTraitName;
  local_a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x4;
  bVar1 = trieste::Token::in(&((n->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr)->type_,(initializer_list<trieste::Token> *)&local_a8);
  if (bVar1) {
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)p);
    if (local_f0._M_ptr == (NodeDef *)0x0) {
      bVar1 = false;
    }
    else {
      local_78._0_8_ = Ident;
      trieste::operator/(&local_a8,n,(Token *)local_78);
      trieste::NodeDef::lookdown
                (&local_e0,local_f0._M_ptr,
                 &(local_a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->location_);
      bVar1 = (long)local_e0.
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e0.
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x10;
      if (bVar1) {
        ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   &(local_e0.
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
        Lookup::make((Lookup *)local_78,p,(Node *)&local_b8);
        Lookup::operator=(p,(Lookup *)local_78);
        Lookup::~Lookup((Lookup *)local_78);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        local_78._0_8_ = local_88;
        local_88._0_8_ = TypeClassName;
        local_88._8_8_ = &TypeAliasName;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        bVar2 = trieste::Token::in(&((n->
                                     super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->type_,(initializer_list<trieste::Token> *)local_78);
        if (bVar2) {
          local_88._0_8_ = TypeArgs;
          trieste::operator/((WFLookup *)local_78,n,(Token *)local_88);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c8,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
          apply_typeargs(p,(Node *)&local_c8);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
        }
      }
      ::std::
      vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 *)&local_e0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    return bVar1;
  }
  __assert_fail("n->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName})",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                ,0x109,"bool verona::resolve_typename(Lookup &, Node)");
}

Assistant:

static bool resolve_typename(Lookup& p, Node n)
  {
    assert(n->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}));
    auto def = p.def;

    if (!def)
      return false;

    auto id = n / Ident;
    auto defs = def->lookdown(id->location());

    if (defs.size() != 1)
      return false;

    p = p.make(*defs.begin());

    if (n->in({TypeClassName, TypeAliasName}))
      apply_typeargs(p, n / TypeArgs);

    return true;
  }